

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator * __thiscall
QMultiHash<QString,_QDBusConnectionPrivate::SignalHook>::detach
          (QMultiHash<QString,_QDBusConnectionPrivate::SignalHook> *this,const_iterator it)

{
  long lVar1;
  piter it_00;
  iterator other;
  bool bVar2;
  MultiNode<QString,_QDBusConnectionPrivate::SignalHook> *pMVar3;
  Data<QHashPrivate::MultiNode<QString,_QDBusConnectionPrivate::SignalHook>_> *in_RSI;
  iterator *in_RDI;
  long in_FS_OFFSET;
  Data<QHashPrivate::MultiNode<QString,_QDBusConnectionPrivate::SignalHook>_> *in_stack_00000008;
  size_t in_stack_00000010;
  Chain *entry;
  qsizetype n;
  Chain **e;
  piter i;
  iterator *this_00;
  Chain *in_stack_ffffffffffffff98;
  QMultiHash<QString,_QDBusConnectionPrivate::SignalHook> *this_01;
  
  this_00 = (iterator *)&stack0x00000008;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QtPrivate::RefCount::isShared((RefCount *)in_RDI);
  if (bVar2) {
    this_01 = (QMultiHash<QString,_QDBusConnectionPrivate::SignalHook> *)0x0;
    pMVar3 = QHashPrivate::
             iterator<QHashPrivate::MultiNode<QString,_QDBusConnectionPrivate::SignalHook>_>::node
                       ((iterator<QHashPrivate::MultiNode<QString,_QDBusConnectionPrivate::SignalHook>_>
                         *)in_RSI);
    for (in_stack_ffffffffffffff98 = pMVar3->value; in_stack_ffffffffffffff98 != *this_00->e;
        in_stack_ffffffffffffff98 = in_stack_ffffffffffffff98->next) {
      this_01 = (QMultiHash<QString,_QDBusConnectionPrivate::SignalHook> *)((long)&this_01->d + 1);
    }
    detach_helper(this_01);
    other.bucket = in_stack_00000010;
    other.d = in_stack_00000008;
    QHashPrivate::Data<QHashPrivate::MultiNode<QString,_QDBusConnectionPrivate::SignalHook>_>::
    detachedIterator(*(Data<QHashPrivate::MultiNode<QString,_QDBusConnectionPrivate::SignalHook>_>
                       **)in_RSI,other);
    QHashPrivate::iterator<QHashPrivate::MultiNode<QString,_QDBusConnectionPrivate::SignalHook>_>::
    node((iterator<QHashPrivate::MultiNode<QString,_QDBusConnectionPrivate::SignalHook>_> *)in_RSI);
    for (; this_01 != (QMultiHash<QString,_QDBusConnectionPrivate::SignalHook> *)0x0;
        this_01 = (QMultiHash<QString,_QDBusConnectionPrivate::SignalHook> *)
                  ((long)&this_01[-1].m_size + 7)) {
    }
  }
  it_00.bucket = (size_t)in_stack_ffffffffffffff98;
  it_00.d = in_RSI;
  iterator::iterator(this_00,it_00,(Chain **)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

iterator detach(const_iterator it)
    {
        auto i = it.i;
        Chain **e = it.e;
        if (d->ref.isShared()) {
            // need to store iterator position before detaching
            qsizetype n = 0;
            Chain *entry = i.node()->value;
            while (entry != *it.e) {
                ++n;
                entry = entry->next;
            }
            Q_ASSERT(entry);
            detach_helper();

            i = d->detachedIterator(i);
            e = &i.node()->value;
            while (n) {
                e = &(*e)->next;
                --n;
            }
            Q_ASSERT(e && *e);
        }
        return iterator(i, e);
    }